

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalNinjaGenerator::WriteProcessedMakefile(cmLocalNinjaGenerator *this,ostream *os)

{
  cmMakefile *this_00;
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  allocator local_49;
  string local_48;
  
  cmGlobalNinjaGenerator::WriteDivider(os);
  poVar2 = std::operator<<(os,"# Write statements declared in CMakeLists.txt:");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,"# ");
  this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  std::__cxx11::string::string((string *)&local_48,"CMAKE_CURRENT_LIST_FILE",&local_49);
  pcVar3 = cmMakefile::GetDefinition(this_00,&local_48);
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_48);
  bVar1 = cmLocalGenerator::IsRootMakefile((cmLocalGenerator *)this);
  if (bVar1) {
    poVar2 = std::operator<<(os,"# Which is the root file.");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  cmGlobalNinjaGenerator::WriteDivider(os);
  std::endl<char,std::char_traits<char>>(os);
  return;
}

Assistant:

void cmLocalNinjaGenerator::WriteProcessedMakefile(std::ostream& os)
{
  cmGlobalNinjaGenerator::WriteDivider(os);
  os
    << "# Write statements declared in CMakeLists.txt:" << std::endl
    << "# "
    << this->Makefile->GetDefinition("CMAKE_CURRENT_LIST_FILE") << std::endl;
  if(this->IsRootMakefile())
    os << "# Which is the root file." << std::endl;
  cmGlobalNinjaGenerator::WriteDivider(os);
  os << std::endl;
}